

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::MixTest::render(MixTest *this,Context *context,Surface *dst)

{
  deUint32 dVar1;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  FboConfig *pFVar5;
  Vector<float,_3> local_378;
  Vector<float,_3> local_36c;
  undefined1 local_360 [8];
  Framebuffer fboB;
  Vector<float,_3> local_324;
  undefined1 local_318 [8];
  Framebuffer fboA;
  deUint32 metaballsTex;
  deUint32 mixShaderID;
  deUint32 singleTexShaderID;
  undefined1 local_2d0 [8];
  MixTexturesShader mixShader;
  SingleTex2DShader singleTexShader;
  Surface *dst_local;
  Context *context_local;
  MixTest *this_local;
  
  SingleTex2DShader::SingleTex2DShader
            ((SingleTex2DShader *)&mixShader.super_ShaderProgram.m_hasGeometryShader);
  MixTexturesShader::MixTexturesShader((MixTexturesShader *)local_2d0);
  dVar1 = (*context->_vptr_Context[0x75])
                    (context,&mixShader.super_ShaderProgram.m_hasGeometryShader);
  fboA.m_stencilbuffer = (*context->_vptr_Context[0x75])(context,local_2d0);
  fboA.m_depthbuffer = 1;
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  createMetaballsTex2D(context,fboA.m_depthbuffer,0x1907,0x1401,0x40,0x40);
  SingleTex2DShader::setUnit
            ((SingleTex2DShader *)&mixShader.super_ShaderProgram.m_hasGeometryShader,context,dVar1,0
            );
  MixTexturesShader::setUnits((MixTexturesShader *)local_2d0,context,fboA.m_stencilbuffer,0,1);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)local_318,context,pFVar5,this->m_fboAWidth,this->m_fboAHeight,0,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)local_318);
  dVar2 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_318);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  (*context->_vptr_Context[5])
            (context,0,0,(ulong)(uint)this->m_fboAWidth,(ulong)(uint)this->m_fboAHeight);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_depthbuffer);
  tcu::Vector<float,_3>::Vector(&local_324,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&fboB.m_depthbuffer,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar1,&local_324,(Vec3 *)&fboB.m_depthbuffer);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)local_360,context,pFVar5,this->m_fboBWidth,this->m_fboBHeight,0,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)local_360);
  dVar1 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_360);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar1);
  (*context->_vptr_Context[5])
            (context,0,0,(ulong)(uint)this->m_fboBWidth,(ulong)(uint)this->m_fboBHeight);
  (*context->_vptr_Context[0x33])(context,0xc11);
  (*context->_vptr_Context[0x32])(context,0,0,0x20,0x40);
  (*context->_vptr_Context[0x2a])(0x3f800000,0);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[0x32])(context,0x20,0,0x20,0x40);
  (*context->_vptr_Context[0x2a])(0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[0x34])(context,0xc11);
  (*context->_vptr_Context[4])(context,0x84c0);
  dVar1 = Functional::Framebuffer::getColorbuffer((Framebuffer *)local_318);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar1);
  (*context->_vptr_Context[4])(context,0x84c1);
  dVar1 = Functional::Framebuffer::getColorbuffer((Framebuffer *)local_360);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar1);
  (*context->_vptr_Context[9])(context,0x8d40,0);
  uVar3 = (*context->_vptr_Context[2])();
  uVar4 = (*context->_vptr_Context[3])();
  (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)uVar4);
  dVar1 = fboA.m_stencilbuffer;
  tcu::Vector<float,_3>::Vector(&local_36c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_378,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar1,&local_36c,&local_378);
  uVar3 = (*context->_vptr_Context[2])();
  uVar4 = (*context->_vptr_Context[3])();
  (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar3,(ulong)uVar4);
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_360);
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_318);
  MixTexturesShader::~MixTexturesShader((MixTexturesShader *)local_2d0);
  SingleTex2DShader::~SingleTex2DShader
            ((SingleTex2DShader *)&mixShader.super_ShaderProgram.m_hasGeometryShader);
  return;
}

Assistant:

void MixTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	singleTexShader;
	MixTexturesShader	mixShader;

	deUint32			singleTexShaderID	= context.createProgram(&singleTexShader);
	deUint32			mixShaderID			= context.createProgram(&mixShader);

	// Texture with metaballs
	deUint32 metaballsTex = 1;
	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	// Setup shaders
	singleTexShader.setUnit(context, singleTexShaderID, 0);
	mixShader.setUnits(context, mixShaderID, 0, 1);

	// Fbo, quad with metaballs texture
	Framebuffer fboA(context, getConfig(), m_fboAWidth, m_fboAHeight);
	fboA.checkCompleteness();
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.viewport(0, 0, m_fboAWidth, m_fboAHeight);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, singleTexShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Fbo, color clears
	Framebuffer fboB(context, getConfig(), m_fboBWidth, m_fboBHeight);
	fboB.checkCompleteness();
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.viewport(0, 0, m_fboBWidth, m_fboBHeight);
	context.enable(GL_SCISSOR_TEST);
	context.scissor(0, 0, 32, 64);
	context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT);
	context.scissor(32, 0, 32, 64);
	context.clearColor(0.0f, 1.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT);
	context.disable(GL_SCISSOR_TEST);

	// Final mix op
	context.activeTexture(GL_TEXTURE0);
	context.bindTexture(GL_TEXTURE_2D, fboA.getColorbuffer());
	context.activeTexture(GL_TEXTURE1);
	context.bindTexture(GL_TEXTURE_2D, fboB.getColorbuffer());
	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
	context.viewport(0, 0, context.getWidth(), context.getHeight());
	sglr::drawQuad(context, mixShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
}